

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

int Aig_ManLevels(Aig_Man_t *p)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  lVar2 = (long)p->vCos->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      uVar4 = *(uint *)((*(ulong *)((long)p->vCos->pArray[lVar3] + 8) & 0xfffffffffffffffe) + 0x1c)
              & 0xffffff;
      if (uVar1 <= uVar4) {
        uVar1 = uVar4;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    return uVar1;
  }
  return 0;
}

Assistant:

int Aig_ManLevels( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, LevelMax = 0;
    Aig_ManForEachCo( p, pObj, i )
        LevelMax = Abc_MaxInt( LevelMax, (int)Aig_ObjFanin0(pObj)->Level );
    return LevelMax;
}